

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BigIndex __thiscall Js::JavascriptArray::BigIndex::operator+(BigIndex *this,uint32 delta)

{
  uint uVar1;
  ulong uVar2;
  BigIndex BVar3;
  BigIndex local_18;
  
  uVar1 = this->index;
  uVar2 = (ulong)uVar1;
  if (uVar2 == 0xffffffff) {
    uVar2 = this->bigIndex;
  }
  else if (!CARRY4(uVar1,delta)) {
    BigIndex(&local_18,uVar1 + delta);
    goto LAB_00b7bb87;
  }
  BigIndex(&local_18,uVar2 + delta);
LAB_00b7bb87:
  BVar3._4_4_ = 0;
  BVar3.index = local_18.index;
  BVar3.bigIndex = local_18.bigIndex;
  return BVar3;
}

Assistant:

JavascriptArray::BigIndex JavascriptArray::BigIndex::operator+(uint32 delta) const
    {
        if (IsSmallIndex())
        {
            uint32 newIndex;
            if (UInt32Math::Add(index, delta, &newIndex))
            {
                return static_cast<uint64>(index) + static_cast<uint64>(delta);
            }
            else
            {
                return newIndex; // ok if newIndex == InvalidIndex
            }
        }
        else
        {
            return bigIndex + static_cast<uint64>(delta);
        }
    }